

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polyline.h
# Opt level: O3

Unique<Polyline<2L>_> __thiscall
anurbs::Polyline<2L>::load(Polyline<2L> *this,Model *model,Json *data)

{
  undefined8 *puVar1;
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  *this_00;
  const_reference pvVar2;
  ulong uVar3;
  pointer *__ptr;
  Index i;
  size_type sVar4;
  long lVar5;
  value_type points;
  Matrix<double,_1,_2,_1,_1,_2> ret;
  undefined1 local_68 [8];
  json_value local_60;
  key_type local_58;
  
  this_00 = (vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
             *)operator_new(0x18);
  (this_00->
  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->
  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->
  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_points).
  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"points","");
  pvVar2 = nlohmann::
           basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(data,&local_58);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_68,pvVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  sVar4 = (size_type)local_68[0];
  if (local_68[0] != null) {
    if (local_68[0] == object) {
      sVar4 = ((local_60.object)->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    else if (local_68[0] == array) {
      sVar4 = (long)(((local_60.object)->m_keys)._M_h._M_bucket_count -
                    (long)((local_60.object)->m_keys)._M_h._M_buckets) >> 4;
    }
    else {
      sVar4 = 1;
    }
  }
  std::
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ::resize(this_00,sVar4);
  lVar5 = 0;
  sVar4 = 0;
  while( true ) {
    uVar3 = (ulong)local_68[0];
    if (local_68[0] != null) {
      if (local_68[0] == object) {
        uVar3 = ((local_60.object)->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      }
      else if (local_68[0] == array) {
        uVar3 = (long)(((local_60.object)->m_keys)._M_h._M_bucket_count -
                      (long)((local_60.object)->m_keys)._M_h._M_buckets) >> 4;
      }
      else {
        uVar3 = 1;
      }
    }
    if ((long)uVar3 <= (long)sVar4) break;
    pvVar2 = nlohmann::
             basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[]((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)local_68,sVar4);
    nlohmann::adl_serializer<Eigen::Matrix<double,1,2,1,1,2>,void>::
    from_json<nlohmann::basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              (pvVar2,(Vector<2> *)&local_58);
    puVar1 = (undefined8 *)
             ((long)&(((this_00->
                       super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->
                     super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data
             + lVar5);
    *puVar1 = local_58._M_dataplus._M_p;
    puVar1[1] = local_58._M_string_length;
    sVar4 = sVar4 + 1;
    lVar5 = lVar5 + 0x10;
  }
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_68);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_68 + 8),local_68[0]);
  return (__uniq_ptr_data<anurbs::Polyline<2L>,_std::default_delete<anurbs::Polyline<2L>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Polyline<2L>,_std::default_delete<anurbs::Polyline<2L>_>,_true,_true>
            )this;
}

Assistant:

static Unique<Polyline<TDimension>> load(Model& model, const Json& data)
    {
        auto result = new_<Polyline<TDimension>>();

        // load Points
        {
            const auto points = data.at("points");

            result->m_points.resize(points.size());

            for (Index i = 0; i < length(points); i++) {
                result->m_points[i] = points[i];
            }
        }

        return result;
    }